

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshpubk.c
# Opt level: O0

_Bool lf_load_keyfile_helper(LoadFileStatus status,char **errptr)

{
  int *piVar1;
  char *local_20;
  char *error;
  char **errptr_local;
  LoadFileStatus status_local;
  
  if (status == LF_OK) {
    errptr_local._7_1_ = true;
  }
  else {
    if (status == LF_TOO_BIG) {
      local_20 = "file is too large to be a key file";
    }
    else {
      if (status != LF_ERROR) {
        __assert_fail("false && \"bad status value in lf_load_keyfile_helper\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/sshpubk.c",
                      0x75,"_Bool lf_load_keyfile_helper(LoadFileStatus, const char **)");
      }
      piVar1 = __errno_location();
      local_20 = strerror(*piVar1);
    }
    if (errptr != (char **)0x0) {
      *errptr = local_20;
    }
    errptr_local._7_1_ = false;
  }
  return errptr_local._7_1_;
}

Assistant:

static inline bool lf_load_keyfile_helper(LoadFileStatus status,
                                          const char **errptr)
{
    const char *error;
    switch (status) {
      case LF_OK:
        return true;
      case LF_TOO_BIG:
        error = "file is too large to be a key file";
        break;
      case LF_ERROR:
        error = strerror(errno);
        break;
      default:
        unreachable("bad status value in lf_load_keyfile_helper");
    }
    if (errptr)
        *errptr = error;
    return false;
}